

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> __thiscall
pbrt::Integrator::Create
          (Integrator *this,string *name,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  bool bVar1;
  char *fmt;
  FileLoc *this_00;
  _Head_base<0UL,_pbrt::Integrator_*,_false> _Var2;
  memory_resource *pmVar3;
  undefined1 local_230 [80];
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1e0;
  CameraHandle local_1d8;
  undefined1 local_1d0 [24];
  SamplerHandle local_1b8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1b0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1a8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_190;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_178;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_160;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_148;
  FileLoc local_130;
  FileLoc local_118;
  FileLoc local_100;
  FileLoc local_e8;
  FileLoc local_d0;
  FileLoc local_b8;
  FileLoc local_a0;
  FileLoc local_88;
  FileLoc local_70;
  FileLoc local_58;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  this->_vptr_Integrator = (_func_int **)0x0;
  local_230._8_8_ = this;
  bVar1 = std::operator==(name,"path");
  if (bVar1) {
    local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(camera->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits;
    local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
    local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(aggregate->
                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                  ).bits;
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_88,lights);
    _Var2._M_head_impl = (Integrator *)local_230._8_8_;
    PathIntegrator::Create
              ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
               (SamplerHandle *)
               &local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (PrimitiveHandle *)
               &local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish,&local_148,&local_88);
    this_00 = &local_88;
    pmVar3 = (memory_resource *)local_230._0_8_;
LAB_003dac8a:
    local_230._0_8_ = (memory_resource *)0x0;
    *(memory_resource **)_Var2._M_head_impl = pmVar3;
    std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
              ((_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)this_00);
  }
  else {
    bVar1 = std::operator==(name,"function");
    if (!bVar1) {
      bVar1 = std::operator==(name,"simplepath");
      if (bVar1) {
        local_160.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
        local_160.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(sampler->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
        local_160.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(aggregate->
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      ).bits;
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_a0,lights
                  );
        _Var2._M_head_impl = (Integrator *)local_230._8_8_;
        SimplePathIntegrator::Create
                  ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                   (SamplerHandle *)
                   &local_160.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (PrimitiveHandle *)
                   &local_160.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_160,&local_a0);
        this_00 = &local_a0;
        pmVar3 = (memory_resource *)local_230._0_8_;
      }
      else {
        bVar1 = std::operator==(name,"lightpath");
        if (bVar1) {
          local_178.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(camera->
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        ).bits;
          local_178.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)(sampler->
                        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
          local_178.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(aggregate->
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        ).bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_b8,
                     lights);
          _Var2._M_head_impl = (Integrator *)local_230._8_8_;
          LightPathIntegrator::Create
                    ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                     (SamplerHandle *)
                     &local_178.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (PrimitiveHandle *)
                     &local_178.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish,&local_178,&local_b8);
          this_00 = &local_b8;
          pmVar3 = (memory_resource *)local_230._0_8_;
        }
        else {
          bVar1 = std::operator==(name,"simplevolpath");
          if (bVar1) {
            local_190.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(camera->
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          ).bits;
            local_190.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(sampler->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
            local_190.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(aggregate->
                          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                          ).bits;
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_d0,
                       lights);
            _Var2._M_head_impl = (Integrator *)local_230._8_8_;
            SimpleVolPathIntegrator::Create
                      ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                       (SamplerHandle *)
                       &local_190.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (PrimitiveHandle *)
                       &local_190.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&local_190,&local_d0);
            this_00 = &local_d0;
            pmVar3 = (memory_resource *)local_230._0_8_;
          }
          else {
            bVar1 = std::operator==(name,"volpath");
            if (bVar1) {
              local_1a8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(camera->
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            ).bits;
              local_1a8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)(sampler->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
              local_1a8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)(aggregate->
                            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                            ).bits;
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_e8,
                         lights);
              _Var2._M_head_impl = (Integrator *)local_230._8_8_;
              VolPathIntegrator::Create
                        ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                         (SamplerHandle *)
                         &local_1a8.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (PrimitiveHandle *)
                         &local_1a8.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&local_1a8,&local_e8);
              this_00 = &local_e8;
              pmVar3 = (memory_resource *)local_230._0_8_;
            }
            else {
              bVar1 = std::operator==(name,"bdpt");
              if (bVar1) {
                local_1b0.bits =
                     (camera->
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     ).bits;
                local_1b8 = (SamplerHandle)
                            (sampler->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
                local_1d0._16_8_ =
                     (aggregate->
                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                     ).bits;
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           &local_100,lights);
                _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                BDPTIntegrator::Create
                          ((BDPTIntegrator *)local_230,parameters,(CameraHandle *)&local_1b0,
                           &local_1b8,(PrimitiveHandle *)(local_1d0 + 0x10),
                           (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           &local_100,loc);
                this_00 = &local_100;
                pmVar3 = (memory_resource *)local_230._0_8_;
              }
              else {
                bVar1 = std::operator==(name,"mlt");
                if (bVar1) {
                  local_1d0._8_8_ =
                       (camera->
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       ).bits;
                  local_1d0._0_8_ =
                       (aggregate->
                       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                       ).bits;
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             &local_118,lights);
                  _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                  MLTIntegrator::Create
                            ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                             (PrimitiveHandle *)(local_1d0 + 8),
                             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             local_1d0,&local_118);
                  this_00 = &local_118;
                  pmVar3 = (memory_resource *)local_230._0_8_;
                }
                else {
                  bVar1 = std::operator==(name,"ambientocclusion");
                  if (bVar1) {
                    local_1d8.
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                             )((ulong)&colorSpace->illuminant | 0x2000000000000);
                    local_1e0.bits =
                         (camera->
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         ).bits;
                    local_230._72_8_ =
                         (sampler->
                         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                         ).bits;
                    local_230._64_8_ =
                         (aggregate->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               &local_58,lights);
                    _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                    AOIntegrator::Create
                              ((ParameterDictionary *)local_230,(SpectrumHandle *)parameters,
                               &local_1d8,(SamplerHandle *)&local_1e0,
                               (PrimitiveHandle *)(local_230 + 0x48),
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               (local_230 + 0x40),&local_58);
                    this_00 = &local_58;
                    pmVar3 = (memory_resource *)local_230._0_8_;
                  }
                  else {
                    bVar1 = std::operator==(name,"randomwalk");
                    if (bVar1) {
                      local_230._56_8_ =
                           (camera->
                           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           ).bits;
                      local_230._48_8_ =
                           (sampler->
                           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           ).bits;
                      local_230._40_8_ =
                           (aggregate->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits;
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 &local_130,lights);
                      _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                      RandomWalkIntegrator::Create
                                ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                                 (SamplerHandle *)(local_230 + 0x38),
                                 (PrimitiveHandle *)(local_230 + 0x30),
                                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 (local_230 + 0x28),&local_130);
                      this_00 = &local_130;
                      pmVar3 = (memory_resource *)local_230._0_8_;
                    }
                    else {
                      bVar1 = std::operator==(name,"sppm");
                      if (!bVar1) {
                        fmt = "%s: integrator type unknown.";
                        goto LAB_003db247;
                      }
                      local_230._32_8_ =
                           (camera->
                           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           ).bits;
                      local_230._24_8_ =
                           (sampler->
                           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           ).bits;
                      local_230._16_8_ =
                           (aggregate->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits;
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 &local_70,lights);
                      _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                      SPPMIntegrator::Create
                                ((ParameterDictionary *)local_230,(RGBColorSpace *)parameters,
                                 (CameraHandle *)colorSpace,(SamplerHandle *)(local_230 + 0x20),
                                 (PrimitiveHandle *)(local_230 + 0x18),
                                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 (local_230 + 0x10),&local_70);
                      this_00 = &local_70;
                      pmVar3 = (memory_resource *)local_230._0_8_;
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_003dac8a;
    }
    local_38.bits =
         (camera->
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         ).bits;
    local_40.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    FunctionIntegrator::Create
              ((FunctionIntegrator *)local_230,parameters,(CameraHandle *)&local_38,
               (SamplerHandle *)&local_40,loc);
    *(undefined8 *)local_230._8_8_ = local_230._0_8_;
    _Var2._M_head_impl = (Integrator *)local_230._8_8_;
    pmVar3 = (memory_resource *)local_230._0_8_;
  }
  if (pmVar3 != (memory_resource *)0x0) {
    ParameterDictionary::ReportUnused(parameters);
    return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           (tuple<pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>)_Var2._M_head_impl;
  }
  fmt = "%s: unable to create integrator.";
LAB_003db247:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "function")
        integrator = FunctionIntegrator::Create(parameters, camera, sampler, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, sampler,
                                            aggregate, lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}